

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

Matrix * __thiscall Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *a)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  pointer pvVar4;
  long lVar5;
  pointer pvVar6;
  pointer pvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  pointer pvVar12;
  float fVar13;
  
  if (this->cols == a->rows) {
    Matrix(__return_storage_ptr__,this->rows,a->cols);
    iVar1 = this->rows;
    if (0 < (long)iVar1) {
      uVar2 = a->cols;
      pvVar4 = (__return_storage_ptr__->m).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = this->cols;
      lVar10 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar5 = *(long *)&pvVar4[lVar10].super__Vector_base<float,_std::allocator<float>_>._M_impl
          ;
          pvVar6 = (this->m).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar7 = (a->m).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            *(undefined4 *)(lVar5 + uVar11 * 4) = 0;
            if (0 < (int)uVar3) {
              lVar8 = *(long *)&pvVar6[lVar10].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl;
              fVar13 = *(float *)(lVar5 + uVar11 * 4);
              uVar9 = 0;
              pvVar12 = pvVar7;
              do {
                fVar13 = fVar13 + *(float *)(lVar8 + uVar9 * 4) *
                                  *(float *)(*(long *)&(pvVar12->
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl + uVar11 * 4);
                *(float *)(lVar5 + uVar11 * 4) = fVar13;
                uVar9 = uVar9 + 1;
                pvVar12 = pvVar12 + 1;
              } while (uVar3 != uVar9);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar2);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("cols == a.rows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/geometry.cpp"
                ,0x2b,"Matrix Matrix::operator*(const Matrix &)");
}

Assistant:

Matrix Matrix::operator*(const Matrix &a) {
    assert(cols == a.rows);
    Matrix result(rows, a.cols);
    for (int i = 0; i < rows; i++) {
        for (int j = 0; j < a.cols; j++) {
            result.m[i][j] = 0.f;
            for (int k = 0; k < cols; k++) {
                result.m[i][j] += m[i][k] * a.m[k][j];
            }
        }
    }
    return result;
}